

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

size_t Curl_conncache_size(Curl_easy *data)

{
  size_t sVar1;
  
  if (data->share == (Curl_share *)0x0) {
    sVar1 = ((data->state).conn_cache)->num_conn;
  }
  else {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    sVar1 = ((data->state).conn_cache)->num_conn;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return sVar1;
}

Assistant:

size_t Curl_conncache_size(struct Curl_easy *data)
{
  size_t num;
  CONN_LOCK(data);
  num = data->state.conn_cache->num_conn;
  CONN_UNLOCK(data);
  return num;
}